

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ConsumeIdentifier(Parser *this,string *output,char *error)

{
  TokenType TVar1;
  ErrorCollector *pEVar2;
  allocator local_31;
  long *local_30 [2];
  long local_20 [2];
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_IDENTIFIER) {
    std::__cxx11::string::_M_assign((string *)output);
    io::Tokenizer::Next(this->input_);
  }
  else {
    std::__cxx11::string::string((string *)local_30,error,&local_31);
    pEVar2 = this->error_collector_;
    if (pEVar2 != (ErrorCollector *)0x0) {
      (*pEVar2->_vptr_ErrorCollector[2])
                (pEVar2,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,local_30);
    }
    this->had_errors_ = true;
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return TVar1 == TYPE_IDENTIFIER;
}

Assistant:

bool Parser::ConsumeIdentifier(string* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
    *output = input_->current().text;
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}